

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  uint uVar1;
  mapped_type pSVar2;
  FileDescriptorTables *pFVar3;
  mapped_type *ppSVar4;
  char *in_RCX;
  ulong uVar5;
  ulong uVar6;
  string local_50;
  
  uVar1 = (p->second->location_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pSVar2 = (mapped_type)((p->second->location_).super_RepeatedPtrFieldBase.rep_)->elements[uVar5];
    pFVar3 = p->first;
    Join<google::protobuf::RepeatedField<int>>
              (&local_50,(protobuf *)&pSVar2->path_,(RepeatedField<int> *)0x2cc666,in_RCX);
    ppSVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pFVar3->locations_by_path_,&local_50);
    *ppSVar4 = pSVar2;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[Join(loc->path(), ",")] = loc;
  }
}